

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

timestamp_t __thiscall
duckdb::VectorTryCastStrictOperator<duckdb::TryCastToTimestampMS>::
Operation<duckdb::string_t,duckdb::timestamp_t>
          (VectorTryCastStrictOperator<duckdb::TryCastToTimestampMS> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  ulong uVar2;
  string_t input_00;
  string_t input_01;
  timestamp_t output;
  timestamp_t local_58;
  string local_50;
  
  input_00.value._8_8_ = input.value._0_8_;
  bVar1 = *(bool *)(*(long *)(idx + 8) + 8);
  uVar2 = (ulong)bVar1;
  input_00.value._0_8_ = this;
  bVar1 = TryCastToTimestampMS::Operation<duckdb::string_t,duckdb::timestamp_t>
                    (input_00,&local_58,bVar1);
  if (!bVar1) {
    input_01.value.pointer.ptr = (char *)uVar2;
    input_01.value._0_8_ = input_00.value._8_8_;
    CastExceptionText<duckdb::string_t,duckdb::timestamp_t>(&local_50,(duckdb *)this,input_01);
    local_58 = HandleVectorCastError::Operation<duckdb::timestamp_t>
                         (&local_50,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (timestamp_t)local_58.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters.strict))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}